

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  bool bVar1;
  __type_conflict _Var2;
  size_type sVar3;
  const_reference pvVar4;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  string local_name;
  string local_pname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *name_local;
  Option *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (name);
  if (((sVar3 < 3) ||
      (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator[](local_20,0), *pvVar4 != '-')) ||
     (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](local_20,1), *pvVar4 != '-')) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (local_20);
    if ((sVar3 < 2) ||
       (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 front(local_20), *pvVar4 != '-')) {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&this->pname_);
      if (!bVar1) {
        ::std::__cxx11::string::string
                  ((string *)(local_name.field_2._M_local_buf + 8),&this->pname_);
        ::std::__cxx11::string::string((string *)local_b0,local_20);
        if (((this->super_OptionBase<CLI::Option>).ignore_underscore_ & 1U) != 0) {
          ::std::__cxx11::string::string
                    ((string *)&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&local_name.field_2 + 8));
          detail::remove_underscore(&local_d0,&local_f0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&local_name.field_2 + 8),&local_d0);
          ::std::__cxx11::string::~string((string *)&local_d0);
          ::std::__cxx11::string::~string((string *)&local_f0);
          ::std::__cxx11::string::string
                    ((string *)&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
          detail::remove_underscore(&local_110,&local_130);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     &local_110);
          ::std::__cxx11::string::~string((string *)&local_110);
          ::std::__cxx11::string::~string((string *)&local_130);
        }
        if (((this->super_OptionBase<CLI::Option>).ignore_case_ & 1U) != 0) {
          ::std::__cxx11::string::string
                    ((string *)&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&local_name.field_2 + 8));
          detail::to_lower(&local_150,&local_170);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&local_name.field_2 + 8),&local_150);
          ::std::__cxx11::string::~string((string *)&local_150);
          ::std::__cxx11::string::~string((string *)&local_170);
          ::std::__cxx11::string::string
                    ((string *)&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
          detail::to_lower(&local_190,&local_1b0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     &local_190);
          ::std::__cxx11::string::~string((string *)&local_190);
          ::std::__cxx11::string::~string((string *)&local_1b0);
        }
        _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_name.field_2 + 8));
        if (_Var2) {
          this_local._7_1_ = 1;
        }
        ::std::__cxx11::string::~string((string *)local_b0);
        ::std::__cxx11::string::~string((string *)(local_name.field_2._M_local_buf + 8));
        if (_Var2) goto LAB_001777f9;
      }
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&this->envname_);
      if (bVar1) {
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = ::std::operator==(local_20,&this->envname_);
      }
    }
    else {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&local_pname.field_2 + 8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (__return_storage_ptr__,local_20,1,0xffffffffffffffff);
      this_local._7_1_ = check_sname(this,__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)(local_pname.field_2._M_local_buf + 8));
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_40,local_20,2,0xffffffffffffffff);
    this_local._7_1_ = check_lname(this,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
LAB_001777f9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool check_name(const std::string &name) const {

        if(name.length() > 2 && name[0] == '-' && name[1] == '-')
            return check_lname(name.substr(2));
        if(name.length() > 1 && name.front() == '-')
            return check_sname(name.substr(1));
        if(!pname_.empty()) {
            std::string local_pname = pname_;
            std::string local_name = name;
            if(ignore_underscore_) {
                local_pname = detail::remove_underscore(local_pname);
                local_name = detail::remove_underscore(local_name);
            }
            if(ignore_case_) {
                local_pname = detail::to_lower(local_pname);
                local_name = detail::to_lower(local_name);
            }
            if(local_name == local_pname) {
                return true;
            }
        }

        if(!envname_.empty()) {
            // this needs to be the original since envname_ shouldn't match on case insensitivity
            return (name == envname_);
        }
        return false;
    }